

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

void MinMaxType::GetDefault(void)

{
  LogicalType *in_RDI;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  duckdb::LogicalType::LogicalType(in_RDI,INTEGER);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"MINMAX","");
  duckdb::LogicalType::SetAlias();
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

static LogicalType GetDefault() {
		auto type = LogicalType(LogicalTypeId::INTEGER);
		type.SetAlias("MINMAX");
		return type;
	}